

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int skip(archive_read *a)

{
  long lVar1;
  long in_RDI;
  mtree *mtree;
  
  lVar1 = **(long **)(in_RDI + 0x948);
  if (-1 < *(int *)(lVar1 + 0x30)) {
    close(*(int *)(lVar1 + 0x30));
    *(undefined4 *)(lVar1 + 0x30) = 0xffffffff;
  }
  return 0;
}

Assistant:

static int
skip(struct archive_read *a)
{
	struct mtree *mtree;

	mtree = (struct mtree *)(a->format->data);
	if (mtree->fd >= 0) {
		close(mtree->fd);
		mtree->fd = -1;
	}
	return (ARCHIVE_OK);
}